

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ir_context.h
# Opt level: O0

void __thiscall spvtools::opt::IRContext::BuildIdToFuncMapping(IRContext *this)

{
  bool bVar1;
  Analysis AVar2;
  type this_00;
  reference this_01;
  mapped_type *ppFVar3;
  uint32_t local_44;
  reference local_40;
  value_type *fn;
  iterator __end2;
  iterator __begin2;
  Module *__range2;
  IRContext *this_local;
  
  std::
  unordered_map<unsigned_int,_spvtools::opt::Function_*,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_spvtools::opt::Function_*>_>_>
  ::clear(&this->id_to_func_);
  this_00 = std::unique_ptr<spvtools::opt::Module,_std::default_delete<spvtools::opt::Module>_>::
            operator*(&this->module_);
  join_0x00000010_0x00000000_ = Module::begin(this_00);
  _fn = Module::end(this_00);
  while( true ) {
    bVar1 = UptrVectorIterator<spvtools::opt::Function,_false>::operator!=
                      ((UptrVectorIterator<spvtools::opt::Function,_false> *)&__end2.iterator_,
                       (UptrVectorIterator<spvtools::opt::Function,_false> *)&fn);
    if (!bVar1) break;
    this_01 = UptrVectorIterator<spvtools::opt::Function,_false>::operator*
                        ((UptrVectorIterator<spvtools::opt::Function,_false> *)&__end2.iterator_);
    local_40 = this_01;
    local_44 = Function::result_id(this_01);
    ppFVar3 = std::
              unordered_map<unsigned_int,_spvtools::opt::Function_*,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_spvtools::opt::Function_*>_>_>
              ::operator[](&this->id_to_func_,&local_44);
    *ppFVar3 = this_01;
    UptrVectorIterator<spvtools::opt::Function,_false>::operator++
              ((UptrVectorIterator<spvtools::opt::Function,_false> *)&__end2.iterator_);
  }
  AVar2 = operator|(this->valid_analyses_,kAnalysisIdToFuncMapping);
  this->valid_analyses_ = AVar2;
  return;
}

Assistant:

void BuildIdToFuncMapping() {
    id_to_func_.clear();
    for (auto& fn : *module_) {
      id_to_func_[fn.result_id()] = &fn;
    }
    valid_analyses_ = valid_analyses_ | kAnalysisIdToFuncMapping;
  }